

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  port_type pVar2;
  _func_void_int *__handler;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  exception *e;
  undefined1 local_1b0 [8];
  error_code ignored_error;
  address local_184;
  string local_168 [8];
  string message;
  undefined1 local_148 [8];
  socket client;
  endpoint_type local_d8;
  address local_bc;
  tcp local_a0;
  basic_endpoint<asio::ip::tcp> local_9c;
  undefined1 local_80 [8];
  acceptor acceptor;
  undefined1 local_20 [8];
  io_context io_context;
  
  io_context.impl_._4_4_ = 0;
  __handler = main::$_0::operator_cast_to_function_pointer((__0 *)((long)&io_context.impl_ + 3));
  signal(2,(__sighandler_t)__handler);
  asio::io_context::io_context((io_context *)local_20);
  local_a0 = asio::ip::tcp::v4();
  asio::ip::basic_endpoint<asio::ip::tcp>::basic_endpoint(&local_9c,&local_a0,0x22c3);
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>
            ((basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)local_80,
             (io_context *)local_20,&local_9c,true,0);
  poVar3 = std::operator<<((ostream *)&std::cout,"loccal addr info: \n addr: ");
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::local_endpoint
            (&local_d8,(basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)local_80);
  asio::ip::basic_endpoint<asio::ip::tcp>::address(&local_bc,&local_d8);
  pbVar4 = asio::ip::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,&local_bc);
  std::ostream::operator<<((ostream *)pbVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"port: ");
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::local_endpoint
            ((endpoint_type *)
             ((long)&client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.executor_
                     .
                     super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                     .prop_fns_ + 4),
             (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)local_80);
  pVar2 = asio::ip::basic_endpoint<asio::ip::tcp>::port
                    ((basic_endpoint<asio::ip::tcp> *)
                     ((long)&client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
                             executor_.
                             super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                             .prop_fns_ + 4));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&g_running);
    if (!bVar1) break;
    asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
    basic_stream_socket<asio::io_context>
              ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)local_148,
               (io_context *)local_20,0);
    asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
    accept<asio::ip::tcp,asio::any_io_executor>
              ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)local_80,
               (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)local_148,0);
    make_daytime_string_abi_cxx11_();
    poVar3 = std::operator<<((ostream *)&std::cout,"msg : ");
    poVar3 = std::operator<<(poVar3,local_168);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"peer client addr = ");
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
              ((endpoint_type *)&ignored_error._M_cat,
               (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)local_148);
    asio::ip::basic_endpoint<asio::ip::tcp>::address
              (&local_184,(basic_endpoint<asio::ip::tcp> *)&ignored_error._M_cat);
    pbVar4 = asio::ip::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,&local_184)
    ;
    std::ostream::operator<<((ostream *)pbVar4,std::endl<char,std::char_traits<char>>);
    std::error_code::error_code((error_code *)local_1b0);
    _e = (mutable_buffer)
         asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
    asio::
    write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffers_1>
              ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)local_148,
               (mutable_buffers_1 *)&e,(error_code *)local_1b0,0);
    std::__cxx11::string::~string(local_168);
    asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::~basic_stream_socket
              ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)local_148);
  }
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::~basic_socket_acceptor
            ((basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)local_80);
  asio::io_context::~io_context((io_context *)local_20);
  poVar3 = std::operator<<((ostream *)&std::cout,"main process exit.... ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
    // SIGINT handler
    signal(SIGINT, [](int sig) {
        g_running = false;
        std::cout << "ctrl+c is pressed .. exit...." <<std::endl;
    });
    
    try {
        asio::io_context io_context;
        tcp::acceptor acceptor(io_context, tcp::endpoint(tcp::v4(), 8899));
        
        std::cout << "loccal addr info: \n addr: " << acceptor.local_endpoint().address() << std::endl;
        std::cout << "port: " << acceptor.local_endpoint().port() << std::endl;
        
        while (g_running) {
            tcp::socket client(io_context);
            acceptor.accept(client);
            std::string message = make_daytime_string();
            std::cout << "msg : " << message  <<std::endl;
            std::cout << "peer client addr = " << client.remote_endpoint().address() << std::endl;

            asio::error_code ignored_error;
            asio::write(client, asio::buffer(message), ignored_error);
            //socket.read_some(asio::buffer(message));   //sync
        }
     } catch (std::exception& e) {
         std::cerr << e.what() << std::endl;
     }

     std::cout << "main process exit.... " <<std::endl;
     return 0;
}